

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::ExitPupilSample> * __thiscall
pbrt::RealisticCamera::SampleExitPupil(RealisticCamera *this,Point2f pFilm,Point2f uLens)

{
  undefined8 uVar1;
  Point2f t;
  bool bVar2;
  size_t sVar3;
  int *piVar4;
  const_reference pvVar5;
  long in_RSI;
  optional<pbrt::ExitPupilSample> *in_RDI;
  float fVar6;
  float fVar7;
  Float FVar8;
  double dVar9;
  undefined1 extraout_var [12];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  Point3f pPupil;
  Float cosTheta;
  Float sinTheta;
  Float pdf;
  Point2f pLens;
  Bounds2f pupilBounds;
  int rIndex;
  Float rFilm;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  float fVar12;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float local_44;
  float fStack_40;
  Bounds2<float> local_3c;
  int local_2c;
  int local_28;
  float local_24;
  undefined8 local_18;
  undefined8 local_10;
  undefined1 extraout_var_00 [56];
  
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_18 = vmovlpd_avx(in_ZMM1._0_16_);
  fVar6 = Sqr<float>((float)local_10);
  fVar7 = Sqr<float>(local_10._4_4_);
  dVar9 = std::sqrt((double)(ulong)(uint)(fVar6 + fVar7));
  local_24 = SUB84(dVar9,0);
  FVar8 = Film::Diagonal((Film *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  auVar11._0_4_ = FVar8 / 2.0;
  auVar11._4_12_ = extraout_var;
  fVar6 = SUB84(dVar9,0) / auVar11._0_4_;
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RSI + 0x448));
  auVar11 = vcvtusi2ss_avx512f(auVar11,sVar3);
  local_28 = (int)(fVar6 * auVar11._0_4_);
  sVar3 = pstd::
          vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
          size((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                *)(in_RSI + 0x448));
  local_2c = (int)sVar3 + -1;
  piVar4 = std::min<int>(&local_2c,&local_28);
  local_28 = *piVar4;
  pvVar5 = pstd::
           vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
           operator[]((vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
                       *)(in_RSI + 0x448),(long)local_28);
  local_3c.pMin.super_Tuple2<pbrt::Point2,_float> = (pvVar5->pMin).super_Tuple2<pbrt::Point2,_float>
  ;
  local_3c.pMax.super_Tuple2<pbrt::Point2,_float> = (pvVar5->pMax).super_Tuple2<pbrt::Point2,_float>
  ;
  bVar2 = Bounds2<float>::IsDegenerate(&local_3c);
  if (bVar2) {
    memset(in_RDI,0,0x14);
    pstd::optional<pbrt::ExitPupilSample>::optional(in_RDI);
  }
  else {
    t.super_Tuple2<pbrt::Point2,_float>.y = in_stack_ffffffffffffff5c;
    t.super_Tuple2<pbrt::Point2,_float>.x = in_stack_ffffffffffffff58;
    auVar10._0_8_ =
         Bounds2<float>::Lerp
                   ((Bounds2<float> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    t);
    auVar10._8_56_ = extraout_var_00;
    uVar1 = vmovlpd_avx(auVar10._0_16_);
    Bounds2<float>::Area
              ((Bounds2<float> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if ((local_24 != 0.0) || (NAN(local_24))) {
      fVar6 = local_10._4_4_ / local_24;
    }
    else {
      fVar6 = 0.0;
    }
    if ((local_24 != 0.0) || (NAN(local_24))) {
      fVar7 = (float)local_10 / local_24;
    }
    else {
      fVar7 = 1.0;
    }
    local_44 = (float)uVar1;
    fStack_40 = (float)((ulong)uVar1 >> 0x20);
    fVar12 = fVar7 * local_44 - fVar6 * fStack_40;
    fVar6 = fVar6 * local_44 + fVar7 * fStack_40;
    LensRearZ((RealisticCamera *)0x8b2e2b);
    Point3<float>::Point3
              ((Point3<float> *)CONCAT44(fVar12,fVar6),in_stack_ffffffffffffff4c,
               in_stack_ffffffffffffff48,0.0);
    pstd::optional<pbrt::ExitPupilSample>::optional
              ((optional<pbrt::ExitPupilSample> *)CONCAT44(fVar12,fVar6),
               (ExitPupilSample *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<ExitPupilSample> RealisticCamera::SampleExitPupil(Point2f pFilm,
                                                                 Point2f uLens) const {
    // Find exit pupil bound for sample distance from film center
    Float rFilm = std::sqrt(Sqr(pFilm.x) + Sqr(pFilm.y));
    int rIndex = rFilm / (film.Diagonal() / 2) * exitPupilBounds.size();
    rIndex = std::min<int>(exitPupilBounds.size() - 1, rIndex);
    Bounds2f pupilBounds = exitPupilBounds[rIndex];
    if (pupilBounds.IsDegenerate())
        return {};

    // Generate sample point inside exit pupil bound
    Point2f pLens = pupilBounds.Lerp(uLens);
    Float pdf = 1 / pupilBounds.Area();

    // Return sample point rotated by angle of _pFilm_ with $+x$ axis
    Float sinTheta = (rFilm != 0) ? pFilm.y / rFilm : 0;
    Float cosTheta = (rFilm != 0) ? pFilm.x / rFilm : 1;
    Point3f pPupil(cosTheta * pLens.x - sinTheta * pLens.y,
                   sinTheta * pLens.x + cosTheta * pLens.y, LensRearZ());
    return ExitPupilSample{pPupil, pdf};
}